

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Emu.cpp
# Opt level: O0

blargg_err_t __thiscall Spc_Emu::start_track_(Spc_Emu *this,int track)

{
  Snes_Spc *this_00;
  int in_ESI;
  Music_Emu *in_RDI;
  double dVar1;
  blargg_err_t blargg_return_err__1;
  blargg_err_t blargg_return_err_;
  long in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  Snes_Spc *local_8;
  
  this_00 = (Snes_Spc *)Music_Emu::start_track_(in_RDI,in_ESI);
  local_8 = this_00;
  if (this_00 == (Snes_Spc *)0x0) {
    Fir_Resampler_::clear((Fir_Resampler_ *)in_RDI);
    SPC_Filter::clear((SPC_Filter *)0x963ad5);
    local_8 = (Snes_Spc *)
              Snes_Spc::load_spc((Snes_Spc *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),this_00,
                                 in_stack_ffffffffffffffd8);
    if (local_8 == (Snes_Spc *)0x0) {
      dVar1 = Music_Emu::gain(in_RDI);
      SPC_Filter::set_gain((SPC_Filter *)&in_RDI[4].silence_count,(int)(dVar1 * 256.0));
      Snes_Spc::clear_echo(this_00);
      local_8 = (Snes_Spc *)0x0;
    }
  }
  return (blargg_err_t)local_8;
}

Assistant:

blargg_err_t Spc_Emu::start_track_( int track )
{
	RETURN_ERR( Music_Emu::start_track_( track ) );
	resampler.clear();
	filter.clear();
	RETURN_ERR( apu.load_spc( file_data, file_size ) );
	filter.set_gain( (int) (gain() * SPC_Filter::gain_unit) );
	apu.clear_echo();
	return 0;
}